

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  byte bVar1;
  long lVar2;
  GCObject *v;
  TValue *fi;
  char *pcVar3;
  GCObject *owner;
  TValue *val;
  GCObject *local_30;
  TValue *local_28;
  
  local_28 = (TValue *)0x0;
  local_30 = (GCObject *)0x0;
  fi = index2value(L,funcindex);
  pcVar3 = aux_upvalue(fi,n,&local_28,&local_30);
  if (pcVar3 != (char *)0x0) {
    lVar2 = (L->top).offset;
    (L->top).p = (StkId)(lVar2 + -0x10);
    v = *(GCObject **)(lVar2 + -0x10);
    (local_28->value_).gc = v;
    bVar1 = *(byte *)(lVar2 + -8);
    local_28->tt_ = bVar1;
    if ((((bVar1 & 0x40) != 0) && ((local_30->marked & 0x20) != 0)) && ((v->marked & 0x18) != 0)) {
      luaC_barrier_(L,local_30,v);
    }
  }
  return pcVar3;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  GCObject *owner = NULL;  /* to avoid warnings */
  TValue *fi;
  lua_lock(L);
  fi = index2value(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner);
  if (name) {
    L->top.p--;
    setobj(L, val, s2v(L->top.p));
    luaC_barrier(L, owner, val);
  }
  lua_unlock(L);
  return name;
}